

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void update_message(void)

{
  MESSAGE *pMVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  MESSAGE *__s;
  ulong uVar5;
  MESSAGE **ppMVar6;
  float fVar7;
  
  iVar2 = al_get_display_width(screen);
  iVar3 = al_get_display_height(screen);
  ppMVar6 = &msg;
  uVar5 = (long)iVar3 / 2 & 0xffffffff;
  __s = msg;
  while (__s != (MESSAGE *)0x0) {
    iVar3 = __s->time;
    if (iVar3 < 100) {
      fVar7 = __s->x * 0.9 + (float)iVar2 * 0.05;
    }
    else {
      fVar7 = (float)(iVar3 + -100) + __s->x;
    }
    __s->x = fVar7;
    __s->y = (float)(int)uVar5 * 0.1 + __s->y * 0.9;
    __s->time = iVar3 + 1;
    sVar4 = strlen(__s->text);
    pMVar1 = __s->next;
    if (fVar7 <= (float)((sVar4 >> 2) + (long)iVar2)) {
      ppMVar6 = &__s->next;
    }
    else {
      *ppMVar6 = pMVar1;
      free(__s);
    }
    uVar5 = (ulong)((int)uVar5 + 0x10);
    __s = pMVar1;
  }
  return;
}

Assistant:

void update_message()
{
   int SCREEN_W = al_get_display_width(screen);
   int SCREEN_H = al_get_display_height(screen);
   MESSAGE **p = &msg;
   MESSAGE *m = msg;
   MESSAGE *tmp;
   int y = SCREEN_H/2;

   while (m) {
      if (m->time < 100) {
	 m->x *= 0.9;
	 m->x += (float)SCREEN_W * 0.05;
      }
      else {
	 m->x += (m->time - 100);
      }

      m->y *= 0.9;
      m->y += y * 0.1;

      m->time++;

      if (m->x > SCREEN_W + strlen(m->text)/4) {
	 *p = m->next;
	 tmp = m;
	 m = m->next;
	 free(tmp);
      }
      else {
	 p = &m->next;
	 m = m->next;
      }

      y += 16;
   }
}